

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qidentityproxymodel.cpp
# Opt level: O2

void __thiscall
QIdentityProxyModelPrivate::sourceLayoutChanged
          (QIdentityProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QObject *this_00;
  bool bVar1;
  long lVar2;
  QModelIndex *pQVar3;
  int i;
  ulong uVar4;
  long lVar5;
  QPersistentModelIndex *this_01;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  Data *local_58;
  QPersistentModelIndex *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  lVar5 = 0;
  lVar2 = 0;
  for (uVar4 = 0; uVar4 < (ulong)(this->proxyIndexes).d.size; uVar4 = uVar4 + 1) {
    pQVar3 = (this->proxyIndexes).d.ptr;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)
               ((long)&((this->layoutChangePersistentIndexes).d.ptr)->d + lVar5));
    (*this_00->_vptr_QObject[0x33])((QModelIndex *)&local_58,this_00,&local_78);
    QAbstractItemModel::changePersistentIndex
              ((QAbstractItemModel *)this_00,(QModelIndex *)((long)&pQVar3->r + lVar2),
               (QModelIndex *)&local_58);
    lVar2 = lVar2 + 0x18;
    lVar5 = lVar5 + 8;
  }
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  QList<QModelIndex>::clear(&this->proxyIndexes);
  local_58 = (Data *)0x0;
  pQStack_50 = (QPersistentModelIndex *)0x0;
  local_48.ptr = (QAbstractItemModel *)0x0;
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)&local_58,(sourceParents->d).size);
  this_01 = (sourceParents->d).ptr;
  for (lVar2 = (sourceParents->d).size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    bVar1 = QPersistentModelIndex::isValid(this_01);
    if (bVar1) {
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
      (*this_00->_vptr_QObject[0x33])((QModelIndex *)&local_78,this_00,&local_90);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&local_90,(QModelIndex *)&local_78);
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                ((QList<QPersistentModelIndex> *)&local_58,(QPersistentModelIndex *)&local_90);
      pQVar3 = &local_90;
    }
    else {
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_78);
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
                ((QList<QPersistentModelIndex> *)&local_58,(QPersistentModelIndex *)&local_78);
      pQVar3 = (QModelIndex *)&local_78;
    }
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)pQVar3);
    this_01 = this_01 + 1;
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this_00,(QList<QPersistentModelIndex> *)&local_58,hint);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIdentityProxyModelPrivate::sourceLayoutChanged(
    const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QIdentityProxyModel);

    for (int i = 0; i < proxyIndexes.size(); ++i) {
        q->changePersistentIndex(proxyIndexes.at(i), q->mapFromSource(layoutChangePersistentIndexes.at(i)));
    }

    layoutChangePersistentIndexes.clear();
    proxyIndexes.clear();

    QList<QPersistentModelIndex> parents;
    parents.reserve(sourceParents.size());
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            parents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        parents << mappedParent;
    }

    emit q->layoutChanged(parents, hint);
}